

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O2

unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
 __thiscall anon_unknown.dwarf_3ed9ed6::ConstPubkeyProvider::Clone(ConstPubkeyProvider *this)

{
  undefined1 uVar1;
  pointer __p;
  _func_int **pp_Var2;
  long lVar3;
  long in_RSI;
  undefined1 *puVar4;
  undefined1 *puVar5;
  long in_FS_OFFSET;
  byte bVar6;
  __uniq_ptr_impl<(anonymous_namespace)::ConstPubkeyProvider,_std::default_delete<(anonymous_namespace)::ConstPubkeyProvider>_>
  local_28;
  long local_20;
  
  bVar6 = 0;
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pp_Var2 = (_func_int **)operator_new(0x50);
  uVar1 = *(undefined1 *)(in_RSI + 0x4d);
  *(undefined4 *)(pp_Var2 + 1) = *(undefined4 *)(in_RSI + 8);
  *pp_Var2 = (_func_int *)&PTR__PubkeyProvider_01149e18;
  puVar4 = (undefined1 *)(in_RSI + 0xc);
  puVar5 = (undefined1 *)((long)pp_Var2 + 0xc);
  for (lVar3 = 0x41; lVar3 != 0; lVar3 = lVar3 + -1) {
    *puVar5 = *puVar4;
    puVar4 = puVar4 + (ulong)bVar6 * -2 + 1;
    puVar5 = puVar5 + (ulong)bVar6 * -2 + 1;
  }
  *(undefined1 *)((long)pp_Var2 + 0x4d) = uVar1;
  local_28._M_t.
  super__Tuple_impl<0UL,_(anonymous_namespace)::ConstPubkeyProvider_*,_std::default_delete<(anonymous_namespace)::ConstPubkeyProvider>_>
  .super__Head_base<0UL,_(anonymous_namespace)::ConstPubkeyProvider_*,_false>._M_head_impl =
       (tuple<(anonymous_namespace)::ConstPubkeyProvider_*,_std::default_delete<(anonymous_namespace)::ConstPubkeyProvider>_>
        )(_Tuple_impl<0UL,_(anonymous_namespace)::ConstPubkeyProvider_*,_std::default_delete<(anonymous_namespace)::ConstPubkeyProvider>_>
          )0x0;
  (this->super_PubkeyProvider)._vptr_PubkeyProvider = pp_Var2;
  std::
  unique_ptr<(anonymous_namespace)::ConstPubkeyProvider,_std::default_delete<(anonymous_namespace)::ConstPubkeyProvider>_>
  ::~unique_ptr((unique_ptr<(anonymous_namespace)::ConstPubkeyProvider,_std::default_delete<(anonymous_namespace)::ConstPubkeyProvider>_>
                 *)&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (__uniq_ptr_data<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>,_true,_true>
            )(__uniq_ptr_data<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>,_true,_true>
              )this;
  }
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<PubkeyProvider> Clone() const override
    {
        return std::make_unique<ConstPubkeyProvider>(m_expr_index, m_pubkey, m_xonly);
    }